

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O1

vector<quadraple,_std::allocator<quadraple>_> * __thiscall
LexicalAnalyzer::GetResult
          (vector<quadraple,_std::allocator<quadraple>_> *__return_storage_ptr__,
          LexicalAnalyzer *this)

{
  pointer pqVar1;
  vector<quadraple,_std::allocator<quadraple>_> *pvVar2;
  ostream *poVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  char local_3b [3];
  vector<quadraple,_std::allocator<quadraple>_> *local_38;
  
  local_38 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=============================================================",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found ",6);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_3b[2] = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3b + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"lexical error(s)",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((this->error).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->error).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"At line ",8);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)((long)&((this->error).
                                           super__Vector_base<quadraple,_std::allocator<quadraple>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->linenumber +
                                  lVar8));
      local_3b[0] = ' ';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3b,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"position ",9);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,*(int *)((long)&((this->error).
                                                  super__Vector_base<quadraple,_std::allocator<quadraple>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 lineposition + lVar8));
      local_3b[1] = 0x3a;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_3b + 1,1);
      pqVar1 = (this->error).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
               super__Vector_impl_data._M_start;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)((long)&(pqVar1->attributevalue)._M_dataplus._M_p + lVar8
                                           ),
                          *(long *)((long)&(pqVar1->attributevalue)._M_string_length + lVar8));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar7 = uVar7 + 1;
      uVar4 = ((long)(this->error).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(this->error).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + 0x48;
    } while (uVar7 <= uVar4 && uVar4 - uVar7 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=============================================================",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  pvVar2 = local_38;
  pqVar1 = (this->result).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(this->result).super__Vector_base<quadraple,_std::allocator<quadraple>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pqVar1;
  if (lVar8 != 0) {
    lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
    lVar8 = lVar8 + (ulong)(lVar8 == 0);
    piVar5 = &pqVar1->lineposition;
    iVar6 = 0;
    iVar9 = 0;
    do {
      if (piVar5[-1] == iVar6) {
        *piVar5 = iVar9;
        iVar9 = iVar9 + 1;
      }
      else {
        *piVar5 = 0;
        iVar6 = iVar6 + 1;
        iVar9 = 1;
      }
      piVar5 = piVar5 + 0x12;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  std::vector<quadraple,_std::allocator<quadraple>_>::vector(local_38,&this->result);
  return pvVar2;
}

Assistant:

std::vector<quadraple> LexicalAnalyzer::GetResult() {
    std::cout<<"============================================================="<<std::endl;
    std::cout<<"Found "<<error.size()<<' '<<"lexical error(s)"<<std::endl;
    for(int i=0;i<error.size();i++){
        std::cout<<"At line "<<error[i].linenumber<<' '<<"position "<<error[i].lineposition<<':'<<error[i].attributevalue<<std::endl;
    }
    std::cout<<"============================================================="<<std::endl;
    int linepos = 0, lineid = 0;
    for (int i = 0; i < result.size(); i++) {
        if (result[i].linenumber == lineid) {
            result[i].lineposition = linepos;
            ++linepos;
        } else {
            result[i].lineposition = 0;
            linepos = 1;
            ++lineid;
        }
    }
    return result;
}